

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

void __thiscall ONX_ModelTest::Dump(ONX_ModelTest *this,ON_TextLog *text_log)

{
  Type test_type;
  bool bVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  long lVar4;
  ON_wString *src;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ON_wString test_log_source_archive;
  ON_wString local_28;
  
  test_type = this->m_test_type;
  pcVar2 = TestTypeToString(test_type);
  ON_TextLog::Print(text_log,"Test type: %s\n",pcVar2);
  bVar1 = ON_wString::IsNotEmpty(&this->m_text_log_3dm_file_path);
  src = &this->m_source_3dm_file_path;
  if (bVar1) {
    src = &this->m_text_log_3dm_file_path;
  }
  ON_wString::ON_wString(&local_28,src);
  pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  ON_TextLog::Print(text_log,L"Source 3dm file path: %ls\n",pwVar3);
  ON_TextLog::Print(text_log,L"Source 3dm file version: %u\n",
                    (ulong)this->m_model_3dm_file_version[0]);
  ON_TextLog::Print(text_log,"Result: ");
  InternalDumpResultAndErrorCount(this->m_test_result,this->m_error_count,text_log);
  bVar1 = 0x30 < this->m_model_3dm_file_version[0] - 1;
  uVar6 = 3;
  if (test_type != ReadWriteReadCompare || bVar1) {
    uVar6 = (uint)test_type;
  }
  if ((this->m_test_result == Pass) &&
     ((this->m_error_count).m_error_count + (this->m_error_count).m_failure_count ==
      -(this->m_error_count).m_warning_count)) {
    lVar4 = 0x50;
    uVar5 = 0;
    do {
      bVar8 = this->m_test_results[uVar5] != Pass;
      bVar9 = *(int *)((long)this->m_model_3dm_file_version + lVar4 + -0x1c) +
              *(int *)((long)this->m_model_3dm_file_version + lVar4 + -0x20) +
              *(int *)((long)this->m_model_3dm_file_version + lVar4 + -0x18) != 0;
      if (bVar9 || bVar8) break;
      lVar4 = lVar4 + 0x18;
      bVar7 = uVar5 < uVar6;
      uVar5 = uVar5 + 1;
    } while (bVar7);
    if (bVar9 || bVar8) goto LAB_004685bf;
    if (test_type != ReadWriteReadCompare || bVar1) goto LAB_004686ed;
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"Compare test skipped because source file version is too old.\n");
  }
  else {
LAB_004685bf:
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"Initialization: ");
    InternalDumpResultAndErrorCount(this->m_test_results[0],this->m_error_counts[0],text_log);
    if (uVar6 != 0) {
      ON_TextLog::Print(text_log,"Read source file: ");
      InternalDumpResultAndErrorCount(this->m_test_results[1],this->m_error_counts[1],text_log);
      if (uVar6 != 1) {
        ON_TextLog::Print(text_log,"Write temporary files: ");
        InternalDumpResultAndErrorCount(this->m_test_results[2],this->m_error_counts[2],text_log);
        if (2 < uVar6) {
          ON_TextLog::Print(text_log,"Read temporary files: ");
          InternalDumpResultAndErrorCount(this->m_test_results[3],this->m_error_counts[3],text_log);
          if (uVar6 != 3) {
            ON_TextLog::Print(text_log,"Compare models from source and temporary file: ");
            InternalDumpResultAndErrorCount
                      (this->m_test_results[4],this->m_error_counts[4],text_log);
          }
        }
      }
    }
  }
  ON_TextLog::PopIndent(text_log);
LAB_004686ed:
  ON_wString::~ON_wString(&local_28);
  return;
}

Assistant:

void ONX_ModelTest::Dump(ON_TextLog& text_log) const
{
  const ONX_ModelTest::Type test_type = TestType();

  text_log.Print("Test type: %s\n", ONX_ModelTest::TestTypeToString(test_type));

  //const ON_wString source_archive = Source3dmFilePath();
  const ON_wString test_log_source_archive = TextLogSource3dmFilePath();
  text_log.Print(L"Source 3dm file path: %ls\n", static_cast<const wchar_t*>(test_log_source_archive));
  text_log.Print(L"Source 3dm file version: %u\n", Source3dmFileVersion());

  text_log.Print("Result: ");
  InternalDumpResultAndErrorCount(m_test_result, m_error_count, text_log);

  //const int i_rwrcompare = static_cast<const unsigned char>(ONX_ModelTest::Type::ReadWriteReadCompare);
  const bool bSkipCompare
    = ONX_ModelTest::SkipCompare(Source3dmFileVersion())
    && ONX_ModelTest::Type::ReadWriteReadCompare == test_type;
  const unsigned int imax
    = bSkipCompare
    ? static_cast<const unsigned char>(ONX_ModelTest::Type::ReadWriteRead)
    : static_cast<const unsigned char>(test_type);
  bool bSkipDetails = InternalCleanPass(m_test_result, m_error_count);
  for (unsigned int i = 0; i <= imax && bSkipDetails; i++)
  {
    bSkipDetails = InternalCleanPass(m_test_results[i], m_error_counts[i]);
  }  

  if (bSkipDetails)
  {
    if (bSkipCompare)
    {
      text_log.PushIndent();
      text_log.Print("Compare test skipped because source file version is too old.\n");
      text_log.PopIndent();
    }
    return;
  }

  text_log.PushIndent();
  for(;;)
  {
    unsigned int i = 0;
    text_log.Print("Initialization: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Read source file: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Write temporary files: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Read temporary files: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Compare models from source and temporary file: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    break;
  }
  text_log.PopIndent();  
}